

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsStrash.c
# Opt level: O1

Aig_Obj_t * Abc_NtkConstructCare_rec(Aig_Man_t *pCare,Aig_Obj_t *pObj,Aig_Man_t *pMan)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  
  if (pObj->TravId == pCare->nTravIds) {
    pAVar1 = (Aig_Obj_t *)(pObj->field_5).pData;
  }
  else {
    pObj->TravId = pCare->nTravIds;
    if ((((*(uint *)&pObj->field_0x18 & 7) != 2) &&
        (pAVar1 = Abc_NtkConstructCare_rec
                            (pCare,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),pMan),
        pAVar1 != (Aig_Obj_t *)0x0)) &&
       (pAVar2 = Abc_NtkConstructCare_rec
                           (pCare,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),pMan),
       pAVar2 != (Aig_Obj_t *)0x0)) {
      pAVar1 = Aig_And(pMan,(Aig_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ (ulong)pAVar1),
                       (Aig_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ (ulong)pAVar2));
      (pObj->field_5).pData = pAVar1;
      return pAVar1;
    }
    (pObj->field_5).pData = (void *)0x0;
    pAVar1 = (Aig_Obj_t *)0x0;
  }
  return pAVar1;
}

Assistant:

Aig_Obj_t * Abc_NtkConstructCare_rec( Aig_Man_t * pCare, Aig_Obj_t * pObj, Aig_Man_t * pMan )
{
    Aig_Obj_t * pObj0, * pObj1;
    if ( Aig_ObjIsTravIdCurrent( pCare, pObj ) )
        return (Aig_Obj_t *)pObj->pData;
    Aig_ObjSetTravIdCurrent( pCare, pObj );
    if ( Aig_ObjIsCi(pObj) )
        return (Aig_Obj_t *)(pObj->pData = NULL);
    pObj0 = Abc_NtkConstructCare_rec( pCare, Aig_ObjFanin0(pObj), pMan );
    if ( pObj0 == NULL )
        return (Aig_Obj_t *)(pObj->pData = NULL);
    pObj1 = Abc_NtkConstructCare_rec( pCare, Aig_ObjFanin1(pObj), pMan );
    if ( pObj1 == NULL )
        return (Aig_Obj_t *)(pObj->pData = NULL);
    pObj0 = Aig_NotCond( pObj0, Aig_ObjFaninC0(pObj) );
    pObj1 = Aig_NotCond( pObj1, Aig_ObjFaninC1(pObj) );
    return (Aig_Obj_t *)(pObj->pData = Aig_And( pMan, pObj0, pObj1 ));
}